

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_val_t * art_find_at(art_node_t *node,art_key_chunk_t *key,uint8_t depth)

{
  _Bool _Var1;
  uint8_t uVar2;
  byte in_DL;
  art_key_chunk_t *in_RSI;
  art_inner_node_t *in_RDI;
  uint8_t common_prefix;
  art_leaf_t *leaf;
  art_node_t *child;
  uint8_t common_prefix_1;
  art_inner_node_t *inner_node;
  undefined8 in_stack_ffffffffffffffc0;
  art_inner_node_t *in_stack_ffffffffffffffc8;
  byte local_19;
  art_inner_node_t *local_10;
  art_val_t *local_8;
  
  local_19 = in_DL;
  local_10 = in_RDI;
  while( true ) {
    _Var1 = art_is_leaf((art_node_t *)local_10);
    if (((_Var1 ^ 0xffU) & 1) == 0) {
      local_8 = (art_val_t *)((ulong)local_10 & 0xfffffffffffffffe);
      if ((local_19 < 6) &&
         (uVar2 = art_common_prefix((art_key_chunk_t *)local_8,'\0','\x06',in_RSI,'\0','\x06'),
         uVar2 != '\x06')) {
        local_8 = (art_val_t *)0x0;
      }
      return local_8;
    }
    uVar2 = art_common_prefix(local_10->prefix,'\0',local_10->prefix_size,in_RSI,local_19,'\x06');
    if (uVar2 != local_10->prefix_size) break;
    in_stack_ffffffffffffffc8 =
         (art_inner_node_t *)
         art_find_child(in_stack_ffffffffffffffc8,
                        (art_key_chunk_t)((ulong)in_stack_ffffffffffffffc0 >> 0x38));
    if (in_stack_ffffffffffffffc8 == (art_inner_node_t *)0x0) {
      return (art_val_t *)0x0;
    }
    local_19 = local_19 + local_10->prefix_size + '\x01';
    local_10 = in_stack_ffffffffffffffc8;
  }
  return (art_val_t *)0x0;
}

Assistant:

static art_val_t *art_find_at(const art_node_t *node,
                              const art_key_chunk_t *key, uint8_t depth) {
    while (!art_is_leaf(node)) {
        art_inner_node_t *inner_node = (art_inner_node_t *)node;
        uint8_t common_prefix =
            art_common_prefix(inner_node->prefix, 0, inner_node->prefix_size,
                              key, depth, ART_KEY_BYTES);
        if (common_prefix != inner_node->prefix_size) {
            return NULL;
        }
        art_node_t *child =
            art_find_child(inner_node, key[depth + inner_node->prefix_size]);
        if (child == NULL) {
            return NULL;
        }
        node = child;
        // Include both the prefix and the child key chunk in the depth.
        depth += inner_node->prefix_size + 1;
    }
    art_leaf_t *leaf = CAST_LEAF(node);
    if (depth >= ART_KEY_BYTES) {
        return (art_val_t *)leaf;
    }
    uint8_t common_prefix =
        art_common_prefix(leaf->key, 0, ART_KEY_BYTES, key, 0, ART_KEY_BYTES);
    if (common_prefix == ART_KEY_BYTES) {
        return (art_val_t *)leaf;
    }
    return NULL;
}